

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  undefined8 layer_00;
  bool bVar1;
  int iVar2;
  Result *pRVar3;
  int64 iVar4;
  string *psVar5;
  Tensor *this_00;
  undefined1 local_248 [32];
  undefined1 local_228 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  undefined1 local_140 [4];
  int rank;
  string local_120;
  ArgSortLayerParams *params;
  undefined1 local_f0 [32];
  undefined1 local_d0 [40];
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  pRVar3 = Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  bVar1 = Result::good(pRVar3);
  Result::~Result((Result *)local_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    validateOutputCount((Result_conflict *)(local_d0 + 0x28),(NeuralNetworkLayer *)r._32_8_,1,1);
    pRVar3 = Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_d0 + 0x28));
    bVar1 = Result::good(pRVar3);
    Result::~Result((Result *)(local_d0 + 0x28));
    layer_00 = r._32_8_;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_f0,"Argsort",(allocator *)((long)&params + 7));
      validateInputOutputRankEquality
                ((Result_conflict *)local_d0,(NeuralNetworkLayer *)layer_00,(string *)local_f0,
                 &this->blobNameToRank);
      pRVar3 = Result::operator=((Result *)(local_70 + 0x28),(Result *)local_d0);
      bVar1 = Result::good(pRVar3);
      Result::~Result((Result *)local_d0);
      std::__cxx11::string::~string((string *)local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_120._M_storage._M_storage =
             (uchar  [8])Specification::NeuralNetworkLayer::argsort((NeuralNetworkLayer *)r._32_8_);
        iVar4 = Specification::ArgSortLayerParams::axis
                          ((ArgSortLayerParams *)local_120._M_storage._M_storage);
        if (iVar4 < 0) {
          psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r._32_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,
                         "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"\', which is not supported. It must be positive.");
          std::__cxx11::string::~string((string *)local_140);
          Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_120);
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          std::__cxx11::string::~string((string *)&local_120);
        }
        else {
          iVar2 = Specification::NeuralNetworkLayer::inputtensor_size
                            ((NeuralNetworkLayer *)r._32_8_);
          if (0 < iVar2) {
            this_00 = Specification::NeuralNetworkLayer::inputtensor
                                ((NeuralNetworkLayer *)r._32_8_,0);
            local_168._M_storage._M_storage._4_4_ = Specification::Tensor::rank(this_00);
            iVar4 = Specification::ArgSortLayerParams::axis
                              ((ArgSortLayerParams *)local_120._M_storage._M_storage);
            if ((iVar4 < 0) ||
               (iVar4 = Specification::ArgSortLayerParams::axis
                                  ((ArgSortLayerParams *)local_120._M_storage._M_storage),
               (int)local_168._M_storage._M_storage._4_4_ <= iVar4)) {
              iVar4 = Specification::ArgSortLayerParams::axis
                                ((ArgSortLayerParams *)local_120._M_storage._M_storage);
              std::__cxx11::to_string((string *)local_228,iVar4);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_228 + 0x20),"Value of \'axis\' is ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_228);
              std::operator+(&local_1e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_228 + 0x20),", but it must be in the range [0,");
              std::__cxx11::to_string((string *)local_248,local_168._M_storage._M_storage._4_4_);
              std::operator+(&local_1c8,&local_1e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_248);
              std::operator+(&local_1a8,&local_1c8,") for layer of type \'ArgSort\' and name \'");
              psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                 ((NeuralNetworkLayer *)r._32_8_);
              std::operator+(&local_188,&local_1a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar5);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_168,&local_188,"\'.");
              std::__cxx11::string::~string((string *)&local_188);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)local_248);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)(local_228 + 0x20));
              std::__cxx11::string::~string((string *)local_228);
              Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_168);
              local_a8.m_message._M_storage._M_storage[0] = '\x01';
              local_a8.m_message._M_storage._M_storage[1] = '\0';
              local_a8.m_message._M_storage._M_storage[2] = '\0';
              local_a8.m_message._M_storage._M_storage[3] = '\0';
              std::__cxx11::string::~string((string *)&local_168);
              goto LAB_00420d04;
            }
          }
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
        }
      }
      else {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        local_a8.m_message._M_storage._M_storage[0] = '\x01';
        local_a8.m_message._M_storage._M_storage[1] = '\0';
        local_a8.m_message._M_storage._M_storage[2] = '\0';
        local_a8.m_message._M_storage._M_storage[3] = '\0';
      }
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_a8.m_message._M_storage._M_storage[0] = '\x01';
      local_a8.m_message._M_storage._M_storage[1] = '\0';
      local_a8.m_message._M_storage._M_storage[2] = '\0';
      local_a8.m_message._M_storage._M_storage[3] = '\0';
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_a8.m_message._M_storage._M_storage[0] = '\x01';
    local_a8.m_message._M_storage._M_storage[1] = '\0';
    local_a8.m_message._M_storage._M_storage[2] = '\0';
    local_a8.m_message._M_storage._M_storage[3] = '\0';
  }
LAB_00420d04:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "Argsort", blobNameToRank)).good()) return r;

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}